

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O2

void __thiscall
wasm::StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::combineInto
          (FunctionStructValuesMap<wasm::LUBFinder> *this,
          StructValuesMap<wasm::LUBFinder> *combinedInfos)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->
            super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
            )._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    StructValuesMap<wasm::LUBFinder>::combineInto
              ((StructValuesMap<wasm::LUBFinder> *)(p_Var1 + 2),combinedInfos);
  }
  return;
}

Assistant:

void combineInto(StructValuesMap<T>& combinedInfos) const {
    for (auto& kv : *this) {
      const StructValuesMap<T>& infos = kv.second;
      infos.combineInto(combinedInfos);
    }
  }